

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O0

bool __thiscall
tinyusdz::SkelAnimation::get_rotations
          (SkelAnimation *this,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *vals,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  undefined1 local_70 [8];
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> v;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *vals_local;
  SkelAnimation *this_local;
  
  v._ts._28_4_ = tinterp;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::
  Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              *)local_70);
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
          ::get_value(&this->rotations,
                      (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                       *)local_70);
  if (bVar1) {
    this_local._7_1_ =
         Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::
         get((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              *)local_70,t,vals,v._ts._28_4_);
  }
  else {
    this_local._7_1_ = false;
  }
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::
  ~Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
               *)local_70);
  return this_local._7_1_;
}

Assistant:

bool SkelAnimation::get_rotations(std::vector<value::quatf> *vals,
                                  const double t,
                                  const value::TimeSampleInterpolationType tinterp) {
  Animatable<std::vector<value::quatf>> v;
  if (rotations.get_value(&v)) {
    // Evaluate at time `t` with `tinterp` interpolation
    return v.get(t, vals, tinterp);
  }

  return false;
}